

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

Iterator * __thiscall
TTD::TTEventList::GetIteratorAtLast_ReplayOnly(Iterator *__return_storage_ptr__,TTEventList *this)

{
  EventLogEntryVTableEntry *vtable;
  size_t pos;
  TTEventListLink *head;
  size_t sVar1;
  
  head = this->m_headBlock;
  if (head == (TTEventListLink *)0x0) {
    vtable = this->m_vtable;
    head = (TTEventListLink *)0x0;
    pos = 0;
  }
  else {
    vtable = this->m_vtable;
    sVar1 = head->StartPos;
    do {
      pos = sVar1;
      sVar1 = vtable[*(uint *)(head->BlockData + pos)].DataSize + pos;
    } while (sVar1 != head->CurrPos);
  }
  Iterator::Iterator(__return_storage_ptr__,head,pos,vtable,&this->m_previousEventMap);
  return __return_storage_ptr__;
}

Assistant:

TTEventList::Iterator TTEventList::GetIteratorAtLast_ReplayOnly() const
    {
        if(this->m_headBlock == nullptr)
        {
            return Iterator(nullptr, 0, this->m_vtable, &this->m_previousEventMap);
        }
        else
        {
            size_t cpos = this->m_headBlock->StartPos;
            size_t ipos = 0;
            do
            {
                ipos = cpos;

                NSLogEvents::EventLogEntry* data = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + cpos);
                cpos += this->m_vtable[(uint32)data->EventKind].DataSize;
            } while(cpos != this->m_headBlock->CurrPos);

            return Iterator(this->m_headBlock, ipos, this->m_vtable, &this->m_previousEventMap);
        }
    }